

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

_Bool xpk_list(XPK *xpk)

{
  uint uVar1;
  XPKEntry *entry;
  uint index;
  
  index = 0;
  uVar1 = printf("%d entry(ies):\n",(ulong)xpk->n_entries);
  if (xpk->n_entries != 0) {
    do {
      putchar(9);
      entry = XPK_EntryAtIndex(xpk,index);
      XPKEntry_Pretty(entry);
      index = index + 1;
      uVar1 = (uint)xpk->n_entries;
    } while (index < uVar1);
  }
  return SUB41(uVar1,0);
}

Assistant:

static bool
xpk_list(const XPK *xpk)
{
	printf("%d entry(ies):\n", xpk->n_entries);
	for (int i = 0; i < xpk->n_entries; i++) {
		printf("\t");
		XPKEntry_Pretty(XPK_EntryAtIndex(xpk, i));
	}
	return true;
}